

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECDecoding.cpp
# Opt level: O1

void __thiscall
ECdecoding::updateState
          (ECdecoding *this,SeqEntry *sequence,bool hit,char2double *nextProbs,char base,
          int increNum)

{
  string *this_00;
  unordered_map<string,_std::pair<int,_SeqEntry>_> *this_01;
  Node *pNVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  size_t sVar3;
  type ppVar4;
  reference pvVar5;
  type pdVar6;
  undefined7 in_register_00000011;
  uint32_t uVar7;
  undefined7 in_register_00000081;
  undefined1 auVar8 [16];
  undefined1 in_ZMM1 [64];
  double ret;
  char local_2d1;
  double local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  char2double *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  pair<robin_hood::detail::Table<false,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<int,_SeqEntry>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  local_2b0;
  pair<int,_SeqEntry> local_298;
  
  auVar8 = in_ZMM1._0_16_;
  local_2d1 = base;
  Deflate::write(&sequence->ac,(int)&sequence->freq,
                 (void *)(CONCAT71(in_register_00000081,base) & 0xffffffff),(size_t)nextProbs);
  if ((sequence->ac).bitout.failedSync == true) {
    checkpointCheck(this,sequence);
    return;
  }
  local_2d0 = (double)CONCAT44(local_2d0._4_4_,(int)CONCAT71(in_register_00000011,hit));
  local_2c0 = nextProbs;
  if (((sequence->ac).bitout.crcFlag == false) && ((sequence->ac).bitout.bCount != 0)) {
    local_2c8 = &sequence->seq;
    pNVar1 = (this->crcCheckpoints).mKeyVals;
    sVar3 = robin_hood::detail::
            Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::findIdx<std::__cxx11::string>
                      ((Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                        *)&this->crcCheckpoints,local_2c8);
    if (pNVar1 + sVar3 == (Node *)(this->crcCheckpoints).mInfo) {
      local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
      SeqEntry::SeqEntry(&local_298.second,sequence);
      __str = local_2c8;
      robin_hood::detail::
      Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
      ::emplace<std::__cxx11::string&,std::pair<int,SeqEntry>>
                (&local_2b0,
                 (Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                  *)&this->crcCheckpoints,local_2c8,&local_298);
      SeqEntry::~SeqEntry(&local_298.second);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&sequence->lastCrc,__str);
    }
  }
  FreqTable::calcNewFreqs(&sequence->freq,local_2d1);
  this_01 = &this->crcCheckpoints;
  local_2b8 = &sequence->lastCrc;
  ppVar4 = robin_hood::detail::
           Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           ::at<std::pair<int,SeqEntry>>
                     ((Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                       *)this_01,local_2b8);
  if (ppVar4->first == 0) {
    local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&this->config,"decode");
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar5,"metric");
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar5,"penalties");
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar5,"crc");
    local_298._0_8_ = 0.0;
    nlohmann::detail::
    get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_double,_0>
              (pvVar5,(double *)&local_298);
    local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298._0_8_
    ;
  }
  if (SUB81(local_2d0,0) == '\0') {
    uVar2 = (sequence->seq)._M_string_length;
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)&this->config,"decode");
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar5,"metric");
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar5,"penalties");
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         *)pvVar5,"no_hit");
    local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
    nlohmann::detail::
    from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_int,_0>
              (pvVar5,&local_298.first);
    auVar8 = vcvtusi2sd_avx512f(auVar8,uVar2 / (ulong)(long)local_298.first);
    local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((double)local_2c8 + auVar8._0_8_);
  }
  local_2d0 = (this->fanos)._M_elems[local_2d0._0_4_ & 0xff];
  pdVar6 = robin_hood::detail::
           Table<true,_80UL,_char,_double,_robin_hood::hash<char,_void>,_std::equal_to<char>_>::
           operator[]<double>(local_2c0,&local_2d1);
  sequence->metric = ((double)local_2c8 - (local_2d0 + *pdVar6)) + sequence->metric;
  this_00 = &sequence->seq;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (this_00,local_2d1);
  uVar7 = increNum + sequence->pos;
  sequence->pos = uVar7;
  if (uVar7 == 1) {
    pNVar1 = (this->crcCheckpoints).mKeyVals;
    sVar3 = robin_hood::detail::
            Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
            ::findIdx<std::__cxx11::string>
                      ((Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                        *)this_01,this_00);
    if (pNVar1 + sVar3 == (Node *)(this->crcCheckpoints).mInfo) {
      local_298._0_8_ = local_298._0_8_ & 0xffffffff00000000;
      SeqEntry::SeqEntry(&local_298.second,sequence);
      robin_hood::detail::
      Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
      ::emplace<std::__cxx11::string&,std::pair<int,SeqEntry>>
                (&local_2b0,
                 (Table<false,80ul,std::__cxx11::string,std::pair<int,SeqEntry>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                  *)this_01,this_00,&local_298);
      SeqEntry::~SeqEntry(&local_298.second);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_replace_aux(local_2b8,0,(sequence->lastCrc)._M_string_length,1,local_2d1);
    }
  }
  queueInsert(this,sequence);
  return;
}

Assistant:

void ECdecoding::updateState(SeqEntry &sequence,
                             bool hit, char2double &nextProbs, char base, int increNum) {
    sequence.ac.write(sequence.freq, (int) base);
    if (sequence.ac.bitout.failedSync) {
        checkpointCheck(sequence);
    } else {
        if (!sequence.ac.bitout.crcFlag && sequence.ac.bitout.bCount) {
            // crcFlag is off (just had a crc check) and the crc check was passed successful.
            if (!crcCheckpoints.count(sequence.seq)) {
                crcCheckpoints.emplace(sequence.seq, std::pair(0, sequence));
                sequence.lastCrc = sequence.seq;
            }
        }
        sequence.freq.calcNewFreqs(base);

        double penalty = 0;
        //int failCount = crcCheckpoints.at(sequence.lastCrc).first;
        if (crcCheckpoints.at(sequence.lastCrc).first)
            penalty = config["decode"]["metric"]["penalties"]["crc"]; //0.6
        if (!hit) {
            penalty += (sequence.seq.size() / static_cast<int>(config["decode"]["metric"]["penalties"]["no_hit"]));
        }

        sequence.metric -= (fanos[hit] + codewordFunc(nextProbs[base]) - penalty);
        sequence.seq += base;
        sequence.pos += increNum;

        // Put the first bases in the crc check hashmap, so that subtrees can get metric penalties
        // if the subtree fails multiple times at the same crc checkpoint. This should
        // reduce the probability of getting stuck in a local optima.
        if (sequence.pos == 1 && !crcCheckpoints.contains(sequence.seq)) {
            crcCheckpoints.emplace(sequence.seq, std::pair(0, sequence));
            sequence.lastCrc = base;
        }
        queueInsert(sequence);
    }
}